

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O0

string * __thiscall phosg::SHA1::bin_abi_cxx11_(string *__return_storage_ptr__,SHA1 *this)

{
  string *__str;
  undefined1 local_38 [8];
  StringWriter w;
  SHA1 *this_local;
  
  w.data.field_2._8_8_ = this;
  StringWriter::StringWriter((StringWriter *)local_38);
  StringWriter::put_u32b((StringWriter *)local_38,this->h[0]);
  StringWriter::put_u32b((StringWriter *)local_38,this->h[1]);
  StringWriter::put_u32b((StringWriter *)local_38,this->h[2]);
  StringWriter::put_u32b((StringWriter *)local_38,this->h[3]);
  StringWriter::put_u32b((StringWriter *)local_38,this->h[4]);
  __str = StringWriter::str_abi_cxx11_((StringWriter *)local_38);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  StringWriter::~StringWriter((StringWriter *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SHA1::bin() const {
  phosg::StringWriter w;
  w.put_u32b(this->h[0]);
  w.put_u32b(this->h[1]);
  w.put_u32b(this->h[2]);
  w.put_u32b(this->h[3]);
  w.put_u32b(this->h[4]);
  return std::move(w.str());
}